

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O1

void cJSON_add_object_should_add_object(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = (cJSON *)(*global_hooks.allocate)(0x40);
  if (object != (cJSON *)0x0) {
    object->child = (cJSON *)0x0;
    *(undefined8 *)&object->type = 0;
    object->valuedouble = 0.0;
    object->string = (char *)0x0;
    object->valuestring = (char *)0x0;
    *(undefined8 *)&object->valueint = 0;
    object->next = (cJSON *)0x0;
    object->prev = (cJSON *)0x0;
    object->type = 0x40;
  }
  cJSON_AddObjectToObject(object,"object");
  pcVar1 = get_object_item(object,"object",1);
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x13d);
  }
  UnityAssertEqualNumber((long)pcVar1->type,0x40,(char *)0x0,0x13e,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cJSON_add_object_should_add_object(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *object = NULL;

    cJSON_AddObjectToObject(root, "object");
    TEST_ASSERT_NOT_NULL(object = cJSON_GetObjectItemCaseSensitive(root, "object"));
    TEST_ASSERT_EQUAL_INT(object->type, cJSON_Object);

    cJSON_Delete(root);
}